

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

DescriptorKeyReference * __thiscall
cfd::core::DescriptorNode::GetKeyReferences
          (DescriptorKeyReference *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  DescriptorKeyType DVar1;
  __type _Var2;
  bool bVar3;
  bool bVar4;
  uint32_t child_num;
  reference __lhs;
  long lVar5;
  CfdException *pCVar6;
  string *psVar7;
  byte bVar8;
  Pubkey pubkey;
  string arg_value;
  ByteData256 tweak_sum;
  string using_key;
  ExtPrivkey xpriv;
  ExtPubkey xpub;
  DescriptorKeyReference local_410;
  KeyData key_data;
  
  DescriptorKeyReference::DescriptorKeyReference(__return_storage_ptr__);
  Pubkey::Pubkey(&pubkey);
  psVar7 = &this->key_info_;
  ::std::__cxx11::string::string((string *)&using_key,(string *)psVar7);
  KeyData::KeyData(&key_data);
  DVar1 = this->key_type_;
  if (1 < DVar1 - kDescriptorKeyBip32) {
    if (DVar1 == kDescriptorKeySchnorr) {
      SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&xpriv,psVar7);
      DescriptorKeyReference::DescriptorKeyReference(&local_410,(SchnorrPubkey *)&xpriv);
      DescriptorKeyReference::operator=(__return_storage_ptr__,&local_410);
      DescriptorKeyReference::~DescriptorKeyReference(&local_410);
      KeyData::KeyData((KeyData *)&local_410,&this->value_,-1,true);
      KeyData::operator=(&key_data,(KeyData *)&local_410);
      KeyData::~KeyData((KeyData *)&local_410);
      DescriptorKeyReference::DescriptorKeyReference(&local_410,&key_data,(string *)0x0);
      DescriptorKeyReference::operator=(__return_storage_ptr__,&local_410);
      DescriptorKeyReference::~DescriptorKeyReference(&local_410);
      SchnorrPubkey::CreatePubkey((Pubkey *)&local_410,(SchnorrPubkey *)&xpriv,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,&local_410);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xpriv);
    }
    else if (DVar1 == kDescriptorKeyPublic) {
      Pubkey::Pubkey((Pubkey *)&local_410,psVar7);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,&local_410);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410);
      DescriptorKeyReference::DescriptorKeyReference(&local_410,&pubkey);
      DescriptorKeyReference::operator=(__return_storage_ptr__,&local_410);
      DescriptorKeyReference::~DescriptorKeyReference(&local_410);
      KeyData::KeyData((KeyData *)&local_410,&this->value_,-1,false);
      KeyData::operator=(&key_data,(KeyData *)&local_410);
      KeyData::~KeyData((KeyData *)&local_410);
      DescriptorKeyReference::DescriptorKeyReference(&local_410,&key_data,(string *)0x0);
      DescriptorKeyReference::operator=(__return_storage_ptr__,&local_410);
      DescriptorKeyReference::~DescriptorKeyReference(&local_410);
    }
    goto LAB_001bcccf;
  }
  arg_value._M_dataplus._M_p = (pointer)&arg_value.field_2;
  arg_value._M_string_length = 0;
  arg_value.field_2._M_local_buf[0] = '\0';
  bVar8 = 1;
  if (this->need_arg_num_ == 0) {
    psVar7 = (string *)0x0;
    bVar4 = true;
  }
  else {
    if ((array_argument ==
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0) ||
       ((array_argument->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (array_argument->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish)) {
      local_410._0_8_ = "cfdcore_descriptor.cpp";
      local_410.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x765;
      local_410.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "GetKeyReferences";
      logger::warn<>((CfdSourceLocation *)&local_410,"Failed to generate pubkey from hdkey.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&local_410,"Failed to generate pubkey from hdkey.",(allocator *)&xpriv);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_410);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    __lhs = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at(array_argument,0);
    ::std::__cxx11::string::string((string *)&local_410,"base",(allocator *)&xpriv);
    _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_410);
    ::std::__cxx11::string::~string((string *)&local_410);
    if (_Var2) {
      ::std::__cxx11::string::_M_assign((string *)&using_key);
      psVar7 = (string *)0x0;
      bVar4 = true;
      bVar8 = 0;
    }
    else {
      ::std::__cxx11::string::assign((char *)&arg_value);
      psVar7 = &arg_value;
      ::std::__cxx11::string::_M_assign((string *)psVar7);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(array_argument);
      bVar4 = false;
    }
  }
  ExtPubkey::ExtPubkey(&xpub);
  ByteData256::ByteData256(&tweak_sum);
  if ((this->tweak_sum_)._M_string_length != 0) {
    ByteData256::ByteData256((ByteData256 *)&local_410,&this->tweak_sum_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum,&local_410);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410);
  }
  if (this->key_type_ == kDescriptorKeyBip32Priv) {
    ExtPrivkey::ExtPrivkey(&xpriv,&using_key,&tweak_sum);
    if (!bVar4) {
      ExtPrivkey::DerivePrivkey((ExtPrivkey *)&local_410,&xpriv,&arg_value);
      ExtPrivkey::operator=(&xpriv,(ExtPrivkey *)&local_410);
      ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&local_410);
    }
    ExtPrivkey::GetExtPubkey((ExtPubkey *)&local_410,&xpriv);
    ExtPubkey::operator=(&xpub,(ExtPubkey *)&local_410);
    ExtPubkey::~ExtPubkey((ExtPubkey *)&local_410);
    DescriptorKeyReference::DescriptorKeyReference(&local_410,&xpriv,psVar7);
    DescriptorKeyReference::operator=(__return_storage_ptr__,&local_410);
    DescriptorKeyReference::~DescriptorKeyReference(&local_410);
    ExtPrivkey::~ExtPrivkey(&xpriv);
  }
  else {
    ExtPubkey::ExtPubkey((ExtPubkey *)&local_410,&using_key,&tweak_sum);
    ExtPubkey::operator=(&xpub,(ExtPubkey *)&local_410);
    ExtPubkey::~ExtPubkey((ExtPubkey *)&local_410);
    if (!bVar4) {
      ExtPubkey::DerivePubkey((ExtPubkey *)&local_410,&xpub,&arg_value);
      ExtPubkey::operator=(&xpub,(ExtPubkey *)&local_410);
      ExtPubkey::~ExtPubkey((ExtPubkey *)&local_410);
    }
    DescriptorKeyReference::DescriptorKeyReference(&local_410,&xpub,psVar7);
    DescriptorKeyReference::operator=(__return_storage_ptr__,&local_410);
    DescriptorKeyReference::~DescriptorKeyReference(&local_410);
  }
  bVar3 = ExtPubkey::IsValid(&xpub);
  if (!bVar3) {
    local_410._0_8_ = "cfdcore_descriptor.cpp";
    local_410.schnorr_pubkey_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x78e;
    local_410.schnorr_pubkey_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "GetKeyReferences";
    logger::warn<>((CfdSourceLocation *)&local_410,"Failed to generate pubkey from hdkey.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&local_410,"Failed to generate pubkey from hdkey.",(allocator *)&xpriv);
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_410);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ExtPubkey::GetPubkey((Pubkey *)&local_410,&xpub);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,&local_410);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410);
  if ((bool)(bVar4 & bVar8)) {
LAB_001bcc13:
    child_num = ExtPubkey::GetChildNum(&xpub);
    KeyData::KeyData((KeyData *)&local_410,&this->value_,child_num,false);
    KeyData::operator=(&key_data,(KeyData *)&local_410);
    KeyData::~KeyData((KeyData *)&local_410);
    DescriptorKeyReference::DescriptorKeyReference(&local_410,&key_data,psVar7);
    DescriptorKeyReference::operator=(__return_storage_ptr__,&local_410);
    DescriptorKeyReference::~DescriptorKeyReference(&local_410);
  }
  else if (arg_value._M_string_length != 0) {
    lVar5 = ::std::__cxx11::string::find((char)&arg_value,0x2f);
    if (lVar5 == -1) goto LAB_001bcc13;
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum);
  ExtPubkey::~ExtPubkey(&xpub);
  ::std::__cxx11::string::~string((string *)&arg_value);
LAB_001bcccf:
  bVar4 = Pubkey::IsValid(&pubkey);
  if (bVar4) {
    KeyData::~KeyData(&key_data);
    ::std::__cxx11::string::~string((string *)&using_key);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
    return __return_storage_ptr__;
  }
  local_410._0_8_ = "cfdcore_descriptor.cpp";
  local_410.schnorr_pubkey_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x7a3;
  local_410.schnorr_pubkey_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = "GetKeyReferences";
  logger::
  warn<cfd::core::DescriptorNodeType_const&,cfd::core::DescriptorKeyType_const&,std::__cxx11::string&>
            ((CfdSourceLocation *)&local_410,"Failed to pubkey. type={}-{}, key_info={}",
             &this->node_type_,&this->key_type_,&using_key);
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_410,"Invalid pubkey data.",(allocator *)&xpriv);
  CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_410);
  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

DescriptorKeyReference DescriptorNode::GetKeyReferences(
    std::vector<std::string>* array_argument) const {
  DescriptorKeyReference result;
  Pubkey pubkey;
  std::string using_key = key_info_;
  KeyData key_data;
  if (key_type_ == DescriptorKeyType::kDescriptorKeyPublic) {
    pubkey = Pubkey(key_info_);
    result = DescriptorKeyReference(pubkey);
    try {
      key_data = KeyData(value_);
      result = DescriptorKeyReference(key_data);
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeySchnorr) {
    SchnorrPubkey schnorr_pubkey = SchnorrPubkey(key_info_);
    result = DescriptorKeyReference(schnorr_pubkey);
    try {
      key_data = KeyData(value_, -1, true);
      result = DescriptorKeyReference(key_data);
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
    pubkey = schnorr_pubkey.CreatePubkey();
  } else if (
      (key_type_ == DescriptorKeyType::kDescriptorKeyBip32) ||
      (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv)) {
    std::string arg_value;
    std::string* arg_pointer = nullptr;
    uint32_t need_arg_num = need_arg_num_;
    bool has_base = false;
    if (need_arg_num == 0) {
      // Fixed key. For strengthened keys, xprv/tprv is required.
    } else if ((array_argument == nullptr) || array_argument->empty()) {
      warn(CFD_LOG_SOURCE, "Failed to generate pubkey from hdkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to generate pubkey from hdkey.");
    } else if (
        (array_argument != nullptr) && (!array_argument->empty()) &&
        (array_argument->at(0) == std::string(kArgumentBaseExtkey))) {
      using_key = base_extkey_;
      need_arg_num = 0;
      has_base = true;
    } else {
      // Dynamic key generation. For strengthened keys, xprv/tprv is required.
      // If array_argument is nullptr, set it to 0 temporarily.
      // (For generate test)
      arg_value = "0";
      if (array_argument != nullptr) {
        arg_value = array_argument->back();
        array_argument->pop_back();
      }
      arg_pointer = &arg_value;
    }

    ExtPubkey xpub;
    ByteData256 tweak_sum;
    if (!tweak_sum_.empty()) tweak_sum = ByteData256(tweak_sum_);
    if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
      ExtPrivkey xpriv(using_key, tweak_sum);
      if (need_arg_num != 0) {
        xpriv = xpriv.DerivePrivkey(arg_value);
      }
      xpub = xpriv.GetExtPubkey();
      result = DescriptorKeyReference(xpriv, arg_pointer);
    } else {
      xpub = ExtPubkey(using_key, tweak_sum);
      if (need_arg_num != 0) {
        xpub = xpub.DerivePubkey(arg_value);
      }
      result = DescriptorKeyReference(xpub, arg_pointer);
    }

    if (!xpub.IsValid()) {
      warn(CFD_LOG_SOURCE, "Failed to generate pubkey from hdkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to generate pubkey from hdkey.");
    }
    pubkey = xpub.GetPubkey();

    try {
      if (((need_arg_num == 0) && (!has_base)) ||
          ((!arg_value.empty()) &&
           (arg_value.find('/') == std::string::npos))) {
        key_data = KeyData(value_, static_cast<int32_t>(xpub.GetChildNum()));
        result = DescriptorKeyReference(key_data, arg_pointer);
      }
    } catch (const CfdException& except) {
      if (value_[0] == '[') throw except;
    }
  }

  if (!pubkey.IsValid()) {
    warn(
        CFD_LOG_SOURCE, "Failed to pubkey. type={}-{}, key_info={}",
        node_type_, key_type_, using_key);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid pubkey data.");
  }
  return result;
}